

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

OPJ_BYTE * opj_jp2_write_colr(opj_jp2_t *jp2,OPJ_UINT32 *p_nb_bytes_written)

{
  uint local_3c;
  OPJ_BYTE *pOStack_38;
  OPJ_UINT32 i;
  OPJ_BYTE *l_current_colr_ptr;
  OPJ_BYTE *l_colr_data;
  OPJ_UINT32 l_colr_size;
  OPJ_UINT32 *p_nb_bytes_written_local;
  opj_jp2_t *jp2_local;
  
  if (jp2 == (opj_jp2_t *)0x0) {
    __assert_fail("jp2 != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                  ,0x330,"OPJ_BYTE *opj_jp2_write_colr(opj_jp2_t *, OPJ_UINT32 *)");
  }
  if (p_nb_bytes_written == (OPJ_UINT32 *)0x0) {
    __assert_fail("p_nb_bytes_written != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                  ,0x331,"OPJ_BYTE *opj_jp2_write_colr(opj_jp2_t *, OPJ_UINT32 *)");
  }
  if ((jp2->meth != 1) && (jp2->meth != 2)) {
    __assert_fail("jp2->meth == 1 || jp2->meth == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                  ,0x332,"OPJ_BYTE *opj_jp2_write_colr(opj_jp2_t *, OPJ_UINT32 *)");
  }
  if (jp2->meth == 1) {
    l_colr_data._4_4_ = 0xf;
  }
  else {
    if (jp2->meth != 2) {
      return (OPJ_BYTE *)0x0;
    }
    if ((jp2->color).icc_profile_len == 0) {
      __assert_fail("jp2->color.icc_profile_len",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                    ,0x339,"OPJ_BYTE *opj_jp2_write_colr(opj_jp2_t *, OPJ_UINT32 *)");
    }
    l_colr_data._4_4_ = (jp2->color).icc_profile_len + 0xb;
  }
  jp2_local = (opj_jp2_t *)opj_calloc(1,(ulong)l_colr_data._4_4_);
  if (jp2_local == (opj_jp2_t *)0x0) {
    jp2_local = (opj_jp2_t *)0x0;
  }
  else {
    opj_write_bytes_LE((OPJ_BYTE *)jp2_local,l_colr_data._4_4_,4);
    opj_write_bytes_LE((OPJ_BYTE *)((long)&jp2_local->j2k + 4),0x636f6c72,4);
    opj_write_bytes_LE((OPJ_BYTE *)&jp2_local->m_validation_list,jp2->meth,1);
    opj_write_bytes_LE((OPJ_BYTE *)((long)&jp2_local->m_validation_list + 1),jp2->precedence,1);
    opj_write_bytes_LE((OPJ_BYTE *)((long)&jp2_local->m_validation_list + 2),jp2->approx,1);
    pOStack_38 = (OPJ_BYTE *)((long)&jp2_local->m_validation_list + 3);
    if (jp2->meth == 1) {
      opj_write_bytes_LE(pOStack_38,jp2->enumcs,4);
    }
    else if (jp2->meth == 2) {
      for (local_3c = 0; local_3c < (jp2->color).icc_profile_len; local_3c = local_3c + 1) {
        opj_write_bytes_LE(pOStack_38,(uint)(jp2->color).icc_profile_buf[local_3c],1);
        pOStack_38 = pOStack_38 + 1;
      }
    }
    *p_nb_bytes_written = l_colr_data._4_4_;
  }
  return (OPJ_BYTE *)jp2_local;
}

Assistant:

static OPJ_BYTE * opj_jp2_write_colr(opj_jp2_t *jp2,
                                     OPJ_UINT32 * p_nb_bytes_written
                                    )
{
    /* room for 8 bytes for box 3 for common data and variable upon profile*/
    OPJ_UINT32 l_colr_size = 11;
    OPJ_BYTE * l_colr_data, * l_current_colr_ptr;

    /* preconditions */
    assert(jp2 != 00);
    assert(p_nb_bytes_written != 00);
    assert(jp2->meth == 1 || jp2->meth == 2);

    switch (jp2->meth) {
    case 1 :
        l_colr_size += 4; /* EnumCS */
        break;
    case 2 :
        assert(jp2->color.icc_profile_len); /* ICC profile */
        l_colr_size += jp2->color.icc_profile_len;
        break;
    default :
        return 00;
    }

    l_colr_data = (OPJ_BYTE *) opj_calloc(1, l_colr_size);
    if (l_colr_data == 00) {
        return 00;
    }

    l_current_colr_ptr = l_colr_data;

    opj_write_bytes(l_current_colr_ptr, l_colr_size,
                    4);            /* write box size */
    l_current_colr_ptr += 4;

    opj_write_bytes(l_current_colr_ptr, JP2_COLR, 4);               /* BPCC */
    l_current_colr_ptr += 4;

    opj_write_bytes(l_current_colr_ptr, jp2->meth, 1);              /* METH */
    ++l_current_colr_ptr;

    opj_write_bytes(l_current_colr_ptr, jp2->precedence, 1);        /* PRECEDENCE */
    ++l_current_colr_ptr;

    opj_write_bytes(l_current_colr_ptr, jp2->approx, 1);            /* APPROX */
    ++l_current_colr_ptr;

    if (jp2->meth ==
            1) { /* Meth value is restricted to 1 or 2 (Table I.9 of part 1) */
        opj_write_bytes(l_current_colr_ptr, jp2->enumcs, 4);
    }       /* EnumCS */
    else {
        if (jp2->meth == 2) {                                      /* ICC profile */
            OPJ_UINT32 i;
            for (i = 0; i < jp2->color.icc_profile_len; ++i) {
                opj_write_bytes(l_current_colr_ptr, jp2->color.icc_profile_buf[i], 1);
                ++l_current_colr_ptr;
            }
        }
    }

    *p_nb_bytes_written = l_colr_size;

    return l_colr_data;
}